

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O2

TIntermTyped * __thiscall
glslang::TIntermediate::promoteConstantUnion
          (TIntermediate *this,TBasicType promoteTo,TIntermConstantUnion *node)

{
  TConstUnionVector **ppTVar1;
  double dVar2;
  TStorageQualifier TVar3;
  TBasicType TVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  undefined4 uVar8;
  int mr;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer pTVar10;
  long lVar11;
  undefined4 extraout_var_01;
  pointer pTVar12;
  ulong uVar13;
  ushort uVar14;
  ulong uVar15;
  anon_union_8_11_a9b10978_for_TConstUnion_0 aVar16;
  ulong uVar17;
  bool bVar18;
  anon_union_8_11_a9b10978_for_TConstUnion_0 aVar19;
  TConstUnionArray leftUnionArray;
  TType local_c8;
  long *plVar9;
  
  iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node);
  uVar6 = TType::computeNumComponents((TType *)CONCAT44(extraout_var,iVar5));
  TConstUnionArray::TConstUnionArray(&leftUnionArray,uVar6);
  ppTVar1 = &(node->constArray).unionArray;
  uVar13 = 0;
  uVar17 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar17 = uVar13;
  }
  iVar5 = promoteTo - EbtFloat;
LAB_0038c874:
  iVar7 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node);
  plVar9 = (long *)CONCAT44(extraout_var_00,iVar7);
  if (uVar13 == uVar17) {
    lVar11 = (**(code **)(*plVar9 + 0x58))(plVar9);
    TVar3 = *(TStorageQualifier *)(lVar11 + 8);
    iVar5 = (**(code **)(*plVar9 + 0x60))(plVar9);
    iVar7 = (**(code **)(*plVar9 + 0x68))(plVar9);
    mr = (**(code **)(*plVar9 + 0x70))(plVar9);
    TType::TType(&local_c8,promoteTo,TVar3 & 0x7f,iVar5,iVar7,mr,false);
    iVar5 = (**(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode)();
    node = addConstantUnion((TIntermediate *)node,&leftUnionArray,&local_c8,
                            (TSourceLoc *)CONCAT44(extraout_var_01,iVar5),false);
switchD_0038c8af_default:
    return &node->super_TIntermTyped;
  }
  uVar8 = (**(code **)(*plVar9 + 0x38))(plVar9);
  switch(uVar8) {
  case 1:
    switch(iVar5) {
    case 0:
    case 1:
    case 2:
      goto switchD_0038c9a6_caseD_0;
    case 3:
switchD_0038c9a6_caseD_3:
      pTVar10 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10[uVar13].field_0.i8Const =
           (char)(int)((*ppTVar1)->
                      super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                      ).
                      super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.dConst;
LAB_0038cd29:
      pTVar10 = pTVar10 + uVar13;
      TVar4 = EbtInt8;
      break;
    case 4:
switchD_0038c9a6_caseD_4:
      pTVar10 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10[uVar13].field_0.i8Const =
           (char)(int)((*ppTVar1)->
                      super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                      ).
                      super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.dConst;
LAB_0038ccd3:
      pTVar10 = pTVar10 + uVar13;
      TVar4 = EbtUint8;
      break;
    case 5:
switchD_0038c9a6_caseD_5:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      pTVar12[uVar13].field_0.i16Const =
           (short)(int)((*ppTVar1)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.dConst;
LAB_0038d106:
      TVar4 = EbtInt16;
      break;
    case 6:
switchD_0038c9a6_caseD_6:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      pTVar12[uVar13].field_0.i16Const =
           (short)(int)((*ppTVar1)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.dConst;
LAB_0038d156:
      TVar4 = EbtUint16;
      break;
    case 7:
switchD_0038c9a6_caseD_7:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      pTVar12[uVar13].field_0.iConst =
           (int)((*ppTVar1)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.dConst;
LAB_0038d25c:
      TVar4 = EbtInt;
      break;
    case 8:
switchD_0038c9a6_caseD_8:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      pTVar12[uVar13].field_0.iConst =
           (int)(long)((*ppTVar1)->
                      super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                      ).
                      super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.dConst;
LAB_0038d213:
      TVar4 = EbtUint;
      break;
    case 9:
switchD_0038c9a6_caseD_9:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      pTVar12[uVar13].field_0.i64Const =
           (long)((*ppTVar1)->
                 super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)
                 .
                 super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.dConst;
LAB_0038d283:
      TVar4 = EbtInt64;
      break;
    case 10:
switchD_0038c9a6_caseD_a:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      dVar2 = ((*ppTVar1)->
              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
              super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.dConst;
      uVar15 = (ulong)dVar2;
      pTVar12[uVar13].field_0.u64Const =
           (long)(dVar2 - 9.223372036854776e+18) & (long)uVar15 >> 0x3f | uVar15;
LAB_0038d1e9:
      TVar4 = EbtUint64;
      break;
    case 0xb:
switchD_0038c9a6_caseD_b:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      pTVar12[uVar13].field_0.bConst =
           ((*ppTVar1)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar13].field_0.dConst != 0.0;
      goto LAB_0038cf8d;
    default:
      goto switchD_0038c8af_default;
    }
    goto LAB_0038d285;
  case 2:
    switch(iVar5) {
    case 0:
    case 1:
    case 2:
      goto switchD_0038c9a6_caseD_0;
    case 3:
      goto switchD_0038c9a6_caseD_3;
    case 4:
      goto switchD_0038c9a6_caseD_4;
    case 5:
      goto switchD_0038c9a6_caseD_5;
    case 6:
      goto switchD_0038c9a6_caseD_6;
    case 7:
      goto switchD_0038c9a6_caseD_7;
    case 8:
      goto switchD_0038c9a6_caseD_8;
    case 9:
      goto switchD_0038c9a6_caseD_9;
    case 10:
      goto switchD_0038c9a6_caseD_a;
    case 0xb:
      goto switchD_0038c9a6_caseD_b;
    default:
      return &node->super_TIntermTyped;
    }
  case 3:
    switch(iVar5) {
    case 0:
    case 1:
    case 2:
switchD_0038c9a6_caseD_0:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = uVar13 * 0x10;
      pTVar10 = pTVar12 + uVar13;
      aVar19 = ((*ppTVar1)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0;
      break;
    case 3:
      goto switchD_0038c9a6_caseD_3;
    case 4:
      goto switchD_0038c9a6_caseD_4;
    case 5:
      goto switchD_0038c9a6_caseD_5;
    case 6:
      goto switchD_0038c9a6_caseD_6;
    case 7:
      goto switchD_0038c9a6_caseD_7;
    case 8:
      goto switchD_0038c9a6_caseD_8;
    case 9:
      goto switchD_0038c9a6_caseD_9;
    case 10:
      goto switchD_0038c9a6_caseD_a;
    case 0xb:
      goto switchD_0038c9a6_caseD_b;
    default:
      goto switchD_0038c8af_default;
    }
    break;
  case 4:
    switch(iVar5) {
    case 0:
    case 1:
    case 2:
switchD_0038c8e3_caseD_0:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      uVar6 = (uint)((*ppTVar1)->
                    super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                    ).
                    super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.i8Const;
      goto LAB_0038cada;
    case 3:
switchD_0038c8e3_caseD_3:
      pTVar10 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10[uVar13].field_0.i8Const =
           ((*ppTVar1)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar13].field_0.i8Const;
      goto LAB_0038cd29;
    case 4:
switchD_0038c8e3_caseD_4:
      pTVar10 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10[uVar13].field_0.i8Const =
           ((*ppTVar1)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar13].field_0.i8Const;
      goto LAB_0038ccd3;
    case 5:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar14 = (ushort)((*ppTVar1)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.i8Const;
LAB_0038d102:
      pTVar10 = pTVar12 + uVar13;
      *(ushort *)&pTVar12[uVar13].field_0 = uVar14;
      goto LAB_0038d106;
    case 6:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar14 = (ushort)((*ppTVar1)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.i8Const;
LAB_0038d152:
      pTVar10 = pTVar12 + uVar13;
      *(ushort *)&pTVar12[uVar13].field_0 = uVar14;
      goto LAB_0038d156;
    case 7:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      uVar6 = (uint)((*ppTVar1)->
                    super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                    ).
                    super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.i8Const;
LAB_0038d259:
      *(uint *)&pTVar12[uVar13].field_0 = uVar6;
      goto LAB_0038d25c;
    case 8:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      uVar6 = (uint)((*ppTVar1)->
                    super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                    ).
                    super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.i8Const;
LAB_0038d210:
      *(uint *)&pTVar12[uVar13].field_0 = uVar6;
      goto LAB_0038d213;
    case 9:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      aVar16 = (anon_union_8_11_a9b10978_for_TConstUnion_0)
               (long)((*ppTVar1)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.i8Const;
LAB_0038d27f:
      pTVar12[uVar13].field_0 = aVar16;
      goto LAB_0038d283;
    case 10:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      aVar19 = (anon_union_8_11_a9b10978_for_TConstUnion_0)
               (long)((*ppTVar1)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.i8Const;
LAB_0038d1e5:
      pTVar12[uVar13].field_0 = aVar19;
      goto LAB_0038d1e9;
    case 0xb:
switchD_0038c926_caseD_b:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      bVar18 = ((*ppTVar1)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.i8Const == '\0';
LAB_0038cf89:
      pTVar12[uVar13].field_0.bConst = !bVar18;
      break;
    default:
      return &node->super_TIntermTyped;
    }
    goto LAB_0038cf8d;
  case 5:
    switch(iVar5) {
    case 0:
    case 1:
    case 2:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      uVar6 = (uint)((*ppTVar1)->
                    super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                    ).
                    super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.u8Const;
      break;
    case 3:
      goto switchD_0038c8e3_caseD_3;
    case 4:
      goto switchD_0038c8e3_caseD_4;
    case 5:
switchD_0038c8e3_caseD_5:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar14 = (ushort)((*ppTVar1)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.u8Const;
      goto LAB_0038d102;
    case 6:
switchD_0038c8e3_caseD_6:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar14 = (ushort)((*ppTVar1)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.u8Const;
      goto LAB_0038d152;
    case 7:
switchD_0038c8e3_caseD_7:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      uVar6 = (uint)((*ppTVar1)->
                    super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                    ).
                    super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.u8Const;
      goto LAB_0038d259;
    case 8:
switchD_0038c8e3_caseD_8:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      uVar6 = (uint)((*ppTVar1)->
                    super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                    ).
                    super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.u8Const;
      goto LAB_0038d210;
    case 9:
switchD_0038c8e3_caseD_9:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      aVar16.i64Const._1_7_ = 0;
      aVar16.i8Const =
           ((*ppTVar1)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar13].field_0.u8Const;
      goto LAB_0038d27f;
    case 10:
switchD_0038c8e3_caseD_a:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      aVar19.i64Const._1_7_ = 0;
      aVar19.i8Const =
           ((*ppTVar1)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar13].field_0.u8Const;
      goto LAB_0038d1e5;
    case 0xb:
      goto switchD_0038c926_caseD_b;
    default:
      return &node->super_TIntermTyped;
    }
    goto LAB_0038cada;
  case 6:
    switch(iVar5) {
    case 0:
    case 1:
    case 2:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      uVar6 = (uint)((*ppTVar1)->
                    super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                    ).
                    super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.i16Const;
      break;
    case 3:
      goto switchD_0038c8e3_caseD_3;
    case 4:
      goto switchD_0038c8e3_caseD_4;
    case 5:
switchD_0038cb02_caseD_5:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      pTVar12[uVar13].field_0.i16Const =
           ((*ppTVar1)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar13].field_0.i16Const;
      goto LAB_0038d106;
    case 6:
switchD_0038cb02_caseD_6:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      pTVar12[uVar13].field_0.i16Const =
           ((*ppTVar1)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar13].field_0.i16Const;
      goto LAB_0038d156;
    case 7:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      uVar6 = (uint)((*ppTVar1)->
                    super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                    ).
                    super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.i16Const;
      goto LAB_0038d259;
    case 8:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      uVar6 = (uint)((*ppTVar1)->
                    super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                    ).
                    super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.i16Const;
      goto LAB_0038d210;
    case 9:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      aVar16 = (anon_union_8_11_a9b10978_for_TConstUnion_0)
               (long)((*ppTVar1)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.i16Const;
      goto LAB_0038d27f;
    case 10:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      aVar19 = (anon_union_8_11_a9b10978_for_TConstUnion_0)
               (long)((*ppTVar1)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.i16Const;
      goto LAB_0038d1e5;
    case 0xb:
switchD_0038cab8_caseD_b:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      bVar18 = ((*ppTVar1)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.i16Const == 0;
      goto LAB_0038cf89;
    default:
      return &node->super_TIntermTyped;
    }
    goto LAB_0038cada;
  case 7:
    switch(iVar5) {
    case 0:
    case 1:
    case 2:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      uVar6 = (uint)((*ppTVar1)->
                    super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                    ).
                    super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.u16Const;
LAB_0038cada:
      lVar11 = uVar13 << 4;
      aVar19 = (uint)(double)uVar6;
      break;
    case 3:
      goto switchD_0038c8e3_caseD_3;
    case 4:
      goto switchD_0038c8e3_caseD_4;
    case 5:
      goto switchD_0038cb02_caseD_5;
    case 6:
      goto switchD_0038cb02_caseD_6;
    case 7:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      uVar6 = (uint)((*ppTVar1)->
                    super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                    ).
                    super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.u16Const;
      goto LAB_0038d259;
    case 8:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      uVar6 = (uint)((*ppTVar1)->
                    super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                    ).
                    super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.u16Const;
      goto LAB_0038d210;
    case 9:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      aVar16.i64Const._2_6_ = 0;
      aVar16.i16Const =
           ((*ppTVar1)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar13].field_0.u16Const;
      goto LAB_0038d27f;
    case 10:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      aVar19.i64Const._2_6_ = 0;
      aVar19.i16Const =
           ((*ppTVar1)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar13].field_0.u16Const;
      goto LAB_0038d1e5;
    case 0xb:
      goto switchD_0038cab8_caseD_b;
    default:
      goto switchD_0038c8af_default;
    }
    break;
  case 8:
    switch(iVar5) {
    case 0:
    case 1:
    case 2:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = uVar13 * 0x10;
      pTVar10 = pTVar12 + uVar13;
      aVar19.dConst =
           (double)((*ppTVar1)->
                   super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                   ).
                   super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.iConst;
      break;
    case 3:
      goto switchD_0038c8e3_caseD_3;
    case 4:
      goto switchD_0038c8e3_caseD_4;
    case 5:
      goto switchD_0038cb02_caseD_5;
    case 6:
      goto switchD_0038cb02_caseD_6;
    case 7:
switchD_0038cb02_caseD_7:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      uVar6 = ((*ppTVar1)->
              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
              super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.iConst;
      goto LAB_0038d259;
    case 8:
switchD_0038cb02_caseD_8:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      uVar6 = ((*ppTVar1)->
              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
              super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.iConst;
      goto LAB_0038d210;
    case 9:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      aVar16 = (anon_union_8_11_a9b10978_for_TConstUnion_0)
               (long)((*ppTVar1)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.iConst;
      goto LAB_0038d27f;
    case 10:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      aVar19 = (anon_union_8_11_a9b10978_for_TConstUnion_0)
               (long)((*ppTVar1)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.iConst;
      goto LAB_0038d1e5;
    case 0xb:
switchD_0038cb5f_caseD_b:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      bVar18 = ((*ppTVar1)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.iConst == 0;
      goto LAB_0038cf89;
    default:
      goto switchD_0038c8af_default;
    }
    break;
  case 9:
    switch(iVar5) {
    case 0:
    case 1:
    case 2:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = uVar13 * 0x10;
      pTVar10 = pTVar12 + uVar13;
      aVar19.dConst =
           (double)((*ppTVar1)->
                   super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                   ).
                   super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.uConst;
      break;
    case 3:
      goto switchD_0038c8e3_caseD_3;
    case 4:
      goto switchD_0038c8e3_caseD_4;
    case 5:
      goto switchD_0038cb02_caseD_5;
    case 6:
      goto switchD_0038cb02_caseD_6;
    case 7:
      goto switchD_0038cb02_caseD_7;
    case 8:
      goto switchD_0038cb02_caseD_8;
    case 9:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      aVar16.i64Const._4_4_ = 0;
      aVar16.iConst =
           ((*ppTVar1)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar13].field_0.uConst;
      goto LAB_0038d27f;
    case 10:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      aVar19.i64Const._4_4_ = 0;
      aVar19.iConst =
           ((*ppTVar1)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar13].field_0.uConst;
      goto LAB_0038d1e5;
    case 0xb:
      goto switchD_0038cb5f_caseD_b;
    default:
      goto switchD_0038c8af_default;
    }
    break;
  case 10:
    switch(iVar5) {
    case 0:
    case 1:
    case 2:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = uVar13 * 0x10;
      pTVar10 = pTVar12 + uVar13;
      aVar19.dConst =
           (double)((*ppTVar1)->
                   super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                   ).
                   super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.i64Const;
      break;
    case 3:
      goto switchD_0038c8e3_caseD_3;
    case 4:
      goto switchD_0038c8e3_caseD_4;
    case 5:
      goto switchD_0038cb02_caseD_5;
    case 6:
      goto switchD_0038cb02_caseD_6;
    case 7:
      goto switchD_0038cb02_caseD_7;
    case 8:
      goto switchD_0038cb02_caseD_8;
    case 9:
switchD_0038cb02_caseD_9:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      aVar16 = ((*ppTVar1)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0;
      goto LAB_0038d27f;
    case 10:
switchD_0038cb02_caseD_a:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      aVar19 = ((*ppTVar1)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0;
      goto LAB_0038d1e5;
    case 0xb:
switchD_0038cb02_caseD_b:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      bVar18 = ((*ppTVar1)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0.i64Const == 0;
      goto LAB_0038cf89;
    default:
      goto switchD_0038c8af_default;
    }
    break;
  case 0xb:
    switch(iVar5) {
    case 0:
    case 1:
    case 2:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      aVar19 = ((*ppTVar1)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar13].field_0;
      pTVar12[uVar13].field_0.dConst =
           ((double)CONCAT44(0x45300000,(int)((ulong)aVar19 >> 0x20)) - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,aVar19.iConst) - 4503599627370496.0);
      break;
    case 3:
      goto switchD_0038c8e3_caseD_3;
    case 4:
      goto switchD_0038c8e3_caseD_4;
    case 5:
      goto switchD_0038cb02_caseD_5;
    case 6:
      goto switchD_0038cb02_caseD_6;
    case 7:
      goto switchD_0038cb02_caseD_7;
    case 8:
      goto switchD_0038cb02_caseD_8;
    case 9:
      goto switchD_0038cb02_caseD_9;
    case 10:
      goto switchD_0038cb02_caseD_a;
    case 0xb:
      goto switchD_0038cb02_caseD_b;
    default:
      return &node->super_TIntermTyped;
    }
    goto LAB_0038cae3;
  case 0xc:
    switch(iVar5) {
    case 0:
    case 1:
    case 2:
      goto switchD_0038c8e3_caseD_0;
    case 3:
      goto switchD_0038c8e3_caseD_3;
    case 4:
      goto switchD_0038c8e3_caseD_4;
    case 5:
      goto switchD_0038c8e3_caseD_5;
    case 6:
      goto switchD_0038c8e3_caseD_6;
    case 7:
      goto switchD_0038c8e3_caseD_7;
    case 8:
      goto switchD_0038c8e3_caseD_8;
    case 9:
      goto switchD_0038c8e3_caseD_9;
    case 10:
      goto switchD_0038c8e3_caseD_a;
    case 0xb:
      pTVar12 = ((leftUnionArray.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = pTVar12 + uVar13;
      pTVar12[uVar13].field_0.i8Const =
           ((*ppTVar1)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar13].field_0.i8Const;
LAB_0038cf8d:
      TVar4 = EbtBool;
      goto LAB_0038d285;
    }
  default:
    goto switchD_0038c8af_default;
  }
  ((anon_union_8_11_a9b10978_for_TConstUnion_0 *)((long)&pTVar12->field_0 + lVar11))->dConst =
       (double)aVar19;
LAB_0038cae3:
  TVar4 = EbtDouble;
LAB_0038d285:
  pTVar10->type = TVar4;
  uVar13 = uVar13 + 1;
  goto LAB_0038c874;
}

Assistant:

TIntermTyped* TIntermediate::promoteConstantUnion(TBasicType promoteTo, TIntermConstantUnion* node) const
{
    const TConstUnionArray& rightUnionArray = node->getConstArray();
    int size = node->getType().computeNumComponents();

    TConstUnionArray leftUnionArray(size);

    for (int i=0; i < size; i++) {

#define PROMOTE(Set, CType, Get) leftUnionArray[i].Set(static_cast<CType>(rightUnionArray[i].Get()))
#define PROMOTE_TO_BOOL(Get) leftUnionArray[i].setBConst(rightUnionArray[i].Get() != 0)

#define TO_ALL(Get)   \
        switch (promoteTo) { \
        case EbtFloat16: PROMOTE(setDConst, double, Get); break; \
        case EbtFloat: PROMOTE(setDConst, double, Get); break; \
        case EbtDouble: PROMOTE(setDConst, double, Get); break; \
        case EbtInt8: PROMOTE(setI8Const, signed char, Get); break; \
        case EbtInt16: PROMOTE(setI16Const, short, Get); break; \
        case EbtInt: PROMOTE(setIConst, int, Get); break; \
        case EbtInt64: PROMOTE(setI64Const, long long, Get); break; \
        case EbtUint8: PROMOTE(setU8Const, unsigned char, Get); break; \
        case EbtUint16: PROMOTE(setU16Const, unsigned short, Get); break; \
        case EbtUint: PROMOTE(setUConst, unsigned int, Get); break; \
        case EbtUint64: PROMOTE(setU64Const, unsigned long long, Get); break; \
        case EbtBool: PROMOTE_TO_BOOL(Get); break; \
        default: return node; \
        }

        switch (node->getType().getBasicType()) {
        case EbtFloat: TO_ALL(getDConst); break;
        case EbtInt: TO_ALL(getIConst); break;
        case EbtUint: TO_ALL(getUConst); break;
        case EbtBool: TO_ALL(getBConst); break;
        case EbtFloat16: TO_ALL(getDConst); break;
        case EbtDouble: TO_ALL(getDConst); break;
        case EbtInt8: TO_ALL(getI8Const); break;
        case EbtInt16: TO_ALL(getI16Const); break;
        case EbtInt64: TO_ALL(getI64Const); break;
        case EbtUint8: TO_ALL(getU8Const); break;
        case EbtUint16: TO_ALL(getU16Const); break;
        case EbtUint64: TO_ALL(getU64Const); break;
        default: return node;
        }
    }

    const TType& t = node->getType();

    return addConstantUnion(leftUnionArray, TType(promoteTo, t.getQualifier().storage, t.getVectorSize(), t.getMatrixCols(), t.getMatrixRows()),
                            node->getLoc());
}